

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addChoices
          (QPDFArgParser *this,string *arg,param_arg_handler_t *handler,bool required,char **choices
          )

{
  char *__s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_61;
  value_type local_60;
  OptionEntry *local_40;
  char **i;
  OptionEntry *oe;
  char **choices_local;
  param_arg_handler_t *ppStack_20;
  bool required_local;
  param_arg_handler_t *handler_local;
  string *arg_local;
  QPDFArgParser *this_local;
  
  oe = (OptionEntry *)choices;
  choices_local._7_1_ = required;
  ppStack_20 = handler;
  handler_local = (param_arg_handler_t *)arg;
  arg_local = (string *)this;
  i = (char **)registerArg(this,arg);
  ((OptionEntry *)i)->parameter_needed = (bool)(choices_local._7_1_ & 1);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&((OptionEntry *)i)->param_arg_handler,handler);
  for (local_40 = oe; *(long *)local_40 != 0; local_40 = (OptionEntry *)&local_40->parameter_name) {
    this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(i + 5);
    __s = *(char **)local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return;
}

Assistant:

void
QPDFArgParser::addChoices(
    std::string const& arg, param_arg_handler_t handler, bool required, char const** choices)
{
    OptionEntry& oe = registerArg(arg);
    oe.parameter_needed = required;
    oe.param_arg_handler = handler;
    for (char const** i = choices; *i; ++i) {
        oe.choices.insert(*i);
    }
}